

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O2

ssize_t __thiscall dap::ContentWriter::write(ContentWriter *this,int __fd,void *__buf,size_t __n)

{
  element_type *peVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  undefined8 *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> header;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  puVar5 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Content-Length: ",&local_91);
  std::__cxx11::to_string(&local_70,puVar5[1]);
  std::operator+(&local_30,&local_50,&local_70);
  std::operator+(&local_90,&local_30,"\r\n\r\n");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  peVar1 = (this->writer).super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cVar2 = (**(code **)((long)*peVar1 + 0x20))
                    (peVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
  if (cVar2 == '\0') {
    uVar4 = 0;
  }
  else {
    peVar1 = (this->writer).super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar3 = (**(code **)((long)*peVar1 + 0x20))(peVar1,*puVar5,puVar5[1]);
    uVar4 = (ulong)uVar3;
  }
  std::__cxx11::string::~string((string *)&local_90);
  return uVar4;
}

Assistant:

bool ContentWriter::write(const std::string& msg) const {
  auto header =
      std::string("Content-Length: ") + std::to_string(msg.size()) + "\r\n\r\n";
  return writer->write(header.data(), header.size()) &&
         writer->write(msg.data(), msg.size());
}